

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> * __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue>::operator=
          (ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *this,
          ArrayBuilder<capnp::compiler::NodeTranslator::UnfinishedValue> *other)

{
  UnfinishedValue *pUVar1;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar2;
  UnfinishedValue *pUVar3;
  ArrayDisposer *pAVar4;
  
  pUVar1 = this->ptr;
  if (pUVar1 != (UnfinishedValue *)0x0) {
    pRVar2 = this->pos;
    pUVar3 = this->endPtr;
    this->ptr = (UnfinishedValue *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
    this->endPtr = (UnfinishedValue *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pUVar1,0x98,((long)pRVar2 - (long)pUVar1 >> 3) * -0x79435e50d79435e5,
               ((long)pUVar3 - (long)pUVar1 >> 3) * -0x79435e50d79435e5,
               ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::UnfinishedValue>::destruct);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (UnfinishedValue *)0x0;
  other->pos = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
  other->endPtr = (UnfinishedValue *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }